

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O2

void __thiscall ktxValidator::validateKvd(ktxValidator *this,validationContext *ctx)

{
  uint *args;
  uint uVar1;
  issue *piVar2;
  bool bVar3;
  int iVar4;
  int *piVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  ktxHashList pkVar9;
  uint *puVar10;
  undefined1 *puVar11;
  bool bVar12;
  uint *puVar13;
  string *this_00;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  bool bVar17;
  float fVar18;
  char *key;
  undefined1 *local_278;
  ktxHashList kvDataHead;
  uint32_t valueLen;
  uint *local_260;
  uint32_t keyLen;
  validationContext *local_250;
  char *prevKey;
  uint32_t keyLen_1;
  uint32_t prevKeyLen;
  undefined1 local_238 [40];
  undefined1 local_210 [40];
  undefined1 local_1e8 [40];
  undefined1 local_1c0 [40];
  undefined1 local_198 [40];
  issue local_170;
  issue local_148;
  issue local_120;
  issue local_f8;
  undefined1 local_d0 [40];
  issue local_a8;
  issue local_80;
  undefined1 local_58 [40];
  
  uVar1 = (ctx->header).keyValueData.byteLength;
  uVar16 = (ulong)uVar1;
  if (uVar16 == 0) {
    return;
  }
  local_260 = (uint *)operator_new__(uVar16);
  std::istream::read((char *)ctx->inp,(long)local_260);
  uVar14 = *(uint *)(ctx->inp + *(long *)(*(long *)ctx->inp + -0x18) + 0x20);
  if ((uVar14 & 5) == 0) {
    if ((uVar14 & 2) != 0) {
      ::issue::issue(&local_a8,&IOError.UnexpectedEOF);
      addIssue<>(this,eFatal,&local_a8);
      piVar2 = &local_a8;
      goto LAB_0010a66c;
    }
  }
  else {
    ::issue::issue(&local_80,&IOError.FileRead);
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    addIssue<char*>(this,eFatal,&local_80,pcVar6);
    piVar2 = &local_80;
LAB_0010a66c:
    std::__cxx11::string::~string((string *)&piVar2->message);
  }
  bVar12 = true;
  uVar15 = 0;
  puVar13 = local_260;
  local_250 = ctx;
  for (uVar14 = 0; (uVar15 < uVar1 && (uVar14 < 0x4b)); uVar14 = uVar14 + 1) {
    args = puVar13 + 1;
    if (((uchar)puVar13[1] == 0xef) && (*(uchar *)((long)puVar13 + 5) == 0xbb)) {
      bVar17 = *(uchar *)((long)puVar13 + 6) == 0xbf;
      puVar10 = (uint *)((long)puVar13 + 7);
      if (!bVar17) {
        puVar10 = args;
      }
    }
    else {
      bVar17 = false;
      puVar10 = args;
    }
    puVar11 = (undefined1 *)(ulong)*puVar13;
    for (; (puVar10 < (uchar *)((long)puVar13 + (long)puVar11) + 4 && ((uchar)*puVar10 != '\0'));
        puVar10 = (uint *)((long)puVar10 + 1)) {
    }
    if (puVar10 == (uint *)((uchar *)((long)puVar13 + (long)puVar11) + 4)) {
      local_278 = puVar11;
      ::issue::issue((issue *)local_d0,&Metadata.MissingNulTerminator);
      addIssue<unsigned_char*>(this,eError,(issue *)local_d0,(uchar *)args);
      std::__cxx11::string::~string((string *)(local_d0 + 8));
      if (bVar17) {
        ::issue::issue(&local_f8,&Metadata.ForbiddenBOM1);
        addIssue<unsigned_char*>(this,eError,&local_f8,(uchar *)args);
        bVar12 = false;
        piVar2 = &local_f8;
        puVar11 = local_278;
        goto LAB_0010a7ad;
      }
      bVar12 = false;
      puVar11 = local_278;
    }
    else if (bVar17) {
      ::issue::issue(&local_120,&Metadata.ForbiddenBOM2);
      addIssue<unsigned_char*>(this,eError,&local_120,(uchar *)args);
      piVar2 = &local_120;
LAB_0010a7ad:
      std::__cxx11::string::~string((string *)&piVar2->message);
    }
    fVar18 = ceilf((float)((ulong)puVar11 & 0xffffffff) * 0.25);
    uVar7 = (ulong)(fVar18 * 4.0);
    uVar7 = (long)(fVar18 * 4.0 - 9.223372e+18) & (long)uVar7 >> 0x3f | uVar7;
    uVar15 = uVar15 + 4 + (int)uVar7;
    puVar13 = (uint *)((long)args + (uVar7 & 0xffffffff));
  }
  if (uVar14 == 0x4b) {
    ::issue::issue(&local_148,&Metadata.InvalidStructure);
    addIssue<int>(this,eError,&local_148,0x4b);
    piVar2 = &local_148;
  }
  else {
    if (uVar15 == uVar1) goto LAB_0010a885;
    ::issue::issue(&local_170,&Metadata.MissingFinalPadding);
    addIssue<>(this,eError,&local_170);
    piVar2 = &local_170;
  }
  std::__cxx11::string::~string((string *)&piVar2->message);
LAB_0010a885:
  kvDataHead = (ktxHashList)0x0;
  if (bVar12) {
    iVar4 = ktxHashList_Deserialize(&kvDataHead,uVar16,local_260);
    if (iVar4 == 0) {
      ktxHashListEntry_GetKey(kvDataHead,&prevKeyLen,&prevKey);
      lVar8 = ktxHashList_Next(kvDataHead);
      for (; lVar8 != 0; lVar8 = ktxHashList_Next(lVar8)) {
        ktxHashListEntry_GetKey(lVar8,&keyLen,&key);
        iVar4 = strcmp(prevKey,key);
        if (0 < iVar4) {
          ::issue::issue((issue *)local_1c0,&Metadata.OutOfOrder);
          addIssue<>(this,eError,(issue *)local_1c0);
          std::__cxx11::string::~string((string *)(local_1c0 + 8));
          break;
        }
      }
      local_278 = local_1e8 + 8;
      bVar17 = false;
      bVar12 = false;
      for (pkVar9 = kvDataHead; pkVar9 != (ktxHashList)0x0;
          pkVar9 = (ktxHashList)ktxHashList_Next(pkVar9)) {
        ktxHashListEntry_GetKey(pkVar9,&keyLen_1,&key);
        ktxHashListEntry_GetValue(pkVar9,&valueLen,&keyLen);
        pcVar6 = key;
        iVar4 = strncasecmp(key,"KTX",3);
        if (iVar4 == 0) {
          bVar3 = validateMetadata(this,local_250,pcVar6,_keyLen,valueLen);
          if (!bVar3) {
            ::issue::issue((issue *)local_1e8,&Metadata.IllegalMetadata);
            addIssue<char*>(this,eError,(issue *)local_1e8,key);
            std::__cxx11::string::~string((string *)(local_1e8 + 8));
          }
          pcVar6 = key;
          iVar4 = strncmp(key,"KTXwriter",9);
          bVar17 = (bool)(bVar17 | iVar4 == 0);
          iVar4 = strncmp(pcVar6,"KTXwriterScParams",0x11);
          bVar12 = (bool)(bVar12 | iVar4 == 0);
        }
        else {
          ::issue::issue((issue *)local_58,&Metadata.CustomMetadata);
          addIssue<char*>(this,eWarning,(issue *)local_58,key);
          std::__cxx11::string::~string((string *)(local_58 + 8));
        }
      }
      if (bVar17) {
        return;
      }
      if (bVar12) {
        ::issue::issue((issue *)local_210,&Metadata.NoRequiredKTXwriter);
        addIssue<>(this,eError,(issue *)local_210);
        this_00 = (string *)(local_210 + 8);
      }
      else {
        ::issue::issue((issue *)local_238,&Metadata.NoKTXwriter);
        addIssue<>(this,eWarning,(issue *)local_238);
        this_00 = (string *)(local_238 + 8);
      }
    }
    else {
      ::issue::issue((issue *)local_198,&System.OutOfMemory);
      addIssue<>(this,eError,(issue *)local_198);
      this_00 = (string *)(local_198 + 8);
    }
    std::__cxx11::string::~string(this_00);
  }
  return;
}

Assistant:

void
ktxValidator::validateKvd(validationContext& ctx)
{
    uint32_t kvdLen = ctx.header.keyValueData.byteLength;
    uint32_t lengthCheck = 0;
    bool allKeysNulTerminated = true;

    if (kvdLen == 0)
        return;

    uint8_t* kvd = new uint8_t[kvdLen];
    ctx.inp->read((char *)kvd, kvdLen);
    if (ctx.inp->fail())
        addIssue(logger::eFatal, IOError.FileRead, strerror(errno));
    else if (ctx.inp->eof())
        addIssue(logger::eFatal, IOError.UnexpectedEOF);

    // Check all kv pairs have valuePadding and it's included in kvdLen;
    uint8_t* pCurKv = kvd;
    uint32_t safetyCount;
    // safetyCount ensures we don't get stuck in an infinite loop in the event
    // the kv data is completely bogus and the "lengths" never add up to kvdLen.
#define MAX_KVPAIRS 75
    for (safetyCount = 0; lengthCheck < kvdLen && safetyCount < MAX_KVPAIRS; safetyCount++) {
        uint32_t curKvLen = *(uint32_t *)pCurKv;
        lengthCheck += sizeof(uint32_t); // Add keyAndValueByteLength to total.
        pCurKv += sizeof(uint32_t); // Move pointer past keyAndValueByteLength.
        uint8_t* p = pCurKv;
        uint8_t* pCurKvEnd = pCurKv + curKvLen;

        // Check for BOM.
        bool bom = false;
        if (*p == 0xEF && *(p+1) == 0xBB && *(p+2) == 0xBF) {
            bom = true;
            p += 3;
        }
        for (; p < pCurKvEnd; p++) {
            if (*p == '\0')
              break;
        }
        bool noNul = (p == pCurKvEnd);
        if (noNul) {
            addIssue(logger::eError, Metadata.MissingNulTerminator, pCurKv);
            allKeysNulTerminated = false;
        }
        if (bom) {
            if (noNul)
                addIssue(logger::eError, Metadata.ForbiddenBOM1, pCurKv);
            else
                addIssue(logger::eError, Metadata.ForbiddenBOM2, pCurKv);
        }
        curKvLen = (uint32_t)padn(4, curKvLen);
        lengthCheck += curKvLen;
        pCurKv += curKvLen;
    }
    if (safetyCount == 75)
        addIssue(logger::eError, Metadata.InvalidStructure, MAX_KVPAIRS);
    else if (lengthCheck != kvdLen)
        addIssue(logger::eError, Metadata.MissingFinalPadding);

    ktxHashList kvDataHead = 0;
    ktxHashListEntry* entry;
    char* prevKey;
    uint32_t prevKeyLen;
    KTX_error_code result;
    bool writerFound = false;
    bool writerScParamsFound = false;

    if (allKeysNulTerminated) {
        result = ktxHashList_Deserialize(&kvDataHead, kvdLen, kvd);
        if (result != KTX_SUCCESS) {
            addIssue(logger::eError, System.OutOfMemory);
            return;
        }

        // Check the entries are sorted
        ktxHashListEntry_GetKey(kvDataHead, &prevKeyLen, &prevKey);
        entry = ktxHashList_Next(kvDataHead);
        for (; entry != NULL; entry = ktxHashList_Next(entry)) {
            uint32_t keyLen;
            char* key;

            ktxHashListEntry_GetKey(entry, &keyLen, &key);
            if (strcmp(prevKey, key) > 0) {
                addIssue(logger::eError, Metadata.OutOfOrder);
                break;
            }
        }

        for (entry = kvDataHead; entry != NULL; entry = ktxHashList_Next(entry)) {
            uint32_t keyLen, valueLen;
            char* key;
            uint8_t* value;

            ktxHashListEntry_GetKey(entry, &keyLen, &key);
            ktxHashListEntry_GetValue(entry, &valueLen, (void**)&value);
            if (strncasecmp(key, "KTX", 3) == 0) {
                if (!validateMetadata(ctx, key, value, valueLen)) {
                    addIssue(logger::eError, Metadata.IllegalMetadata, key);
                }
                if (strncmp(key, "KTXwriter", 9) == 0)
                    writerFound = true;
                if (strncmp(key, "KTXwriterScParams", 17) == 0)
                    writerScParamsFound = true;
            } else {
                addIssue(logger::eWarning, Metadata.CustomMetadata, key);
            }
        }
        if (!writerFound) {
            if (writerScParamsFound)
                addIssue(logger::eError, Metadata.NoRequiredKTXwriter);
            else
                addIssue(logger::eWarning, Metadata.NoKTXwriter);
        }
    }
}